

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O3

void __thiscall
flatbuffers::python::PythonGenerator::GetUnionField
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr,
          ImportMap *imports)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  Value *type;
  pointer pcVar3;
  int iVar4;
  undefined8 *puVar5;
  long *plVar6;
  size_type *psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong *puVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string *psVar11;
  undefined8 uVar12;
  string return_ty;
  ImportMapEntry import_entry;
  string local_158;
  undefined1 local_138 [32];
  _Alloc_hider local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string *local_b8;
  _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [32];
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  FieldDef *local_48;
  PythonGenerator *local_40;
  Type *local_38;
  
  local_b8 = code_ptr;
  local_b0 = (_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)imports;
  GenReceiver(this,struct_def,code_ptr);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"flatbuffers.table.Table","");
  type = &field->value;
  GenTypeGet_abi_cxx11_((string *)local_88,this,&type->type);
  iVar4 = std::__cxx11::string::compare(local_88);
  pcVar3 = local_88 + 0x10;
  if ((pointer)local_88._0_8_ != pcVar3) {
    operator_delete((void *)local_88._0_8_,CONCAT71(local_88._17_7_,local_88[0x10]) + 1);
  }
  local_88._8_8_ = 0;
  local_88[0x10] = '\0';
  local_68._M_p = (pointer)&local_58;
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_88._0_8_ = pcVar3;
  local_38 = &type->type;
  if (iVar4 == 0) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[18],_const_char_(&)[6],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_138,(char (*) [18])"flatbuffers.table",(char (*) [6])0x37066a);
    std::__cxx11::string::operator=((string *)local_88,(string *)local_138);
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_p != &local_108) {
      operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
    }
    psVar11 = local_b8;
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
  }
  else {
    GenTypeGet_abi_cxx11_((string *)local_138,this,&type->type);
    std::__cxx11::string::operator=((string *)&local_a8,(string *)local_138);
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_138 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._0_8_ != paVar1) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    GenPackageReference_abi_cxx11_(&local_158,this,&type->type);
    GenTypeGet_abi_cxx11_(&local_f8,this,&type->type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p == &local_158.field_2) {
      local_138._24_8_ = local_158.field_2._8_8_;
      local_138._0_8_ = paVar1;
    }
    else {
      local_138._0_8_ = local_158._M_dataplus._M_p;
    }
    local_138._16_8_ = local_158.field_2._M_allocated_capacity;
    local_138._8_8_ = local_158._M_string_length;
    local_158._M_string_length = 0;
    local_158.field_2._M_allocated_capacity =
         local_158.field_2._M_allocated_capacity & 0xffffffffffffff00;
    paVar8 = &local_f8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == paVar8) {
      local_108._8_8_ = local_f8.field_2._8_8_;
      local_118._M_p = (pointer)&local_108;
    }
    else {
      local_118._M_p = local_f8._M_dataplus._M_p;
    }
    local_108._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
    local_110 = local_f8._M_string_length;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity =
         local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    local_f8._M_dataplus._M_p = (pointer)paVar8;
    local_48 = field;
    local_40 = this;
    std::__cxx11::string::operator=((string *)local_88,(string *)local_138);
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_p != &local_108) {
      operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
    }
    field = local_48;
    psVar11 = local_b8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._0_8_ != paVar1) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar8) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    this = local_40;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
  }
  (*(this->namer_).super_Namer._vptr_Namer[4])(&local_158,&this->namer_,field);
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
  psVar2 = (size_type *)(local_138 + 0x10);
  psVar7 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar7) {
    local_138._16_8_ = *psVar7;
    local_138._24_8_ = puVar5[3];
    local_138._0_8_ = psVar2;
  }
  else {
    local_138._16_8_ = *psVar7;
    local_138._0_8_ = (size_type *)*puVar5;
  }
  local_138._8_8_ = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar11,local_138._0_8_);
  if ((size_type *)local_138._0_8_ != psVar2) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  paVar1 = &local_158.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((((this->super_BaseGenerator).parser_)->opts).python_typing == true) {
    std::operator+(&local_158," -> Optional[",&local_a8);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
    plVar6 = (long *)(local_138 + 0x10);
    psVar7 = puVar5 + 2;
    if ((size_type *)*puVar5 == psVar7) {
      local_138._16_8_ = *psVar7;
      local_138._24_8_ = puVar5[3];
      local_138._0_8_ = plVar6;
    }
    else {
      local_138._16_8_ = *psVar7;
      local_138._0_8_ = (size_type *)*puVar5;
    }
    local_138._8_8_ = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_b8,local_138._0_8_);
    if ((long *)local_138._0_8_ != plVar6) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[7],_const_char_(&)[9],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_138,(char (*) [7])0x37e72c,(char (*) [9])"Optional");
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              (local_b0,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_p != &local_108) {
      operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
    }
    if ((long *)local_138._0_8_ != plVar6) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string,std::__cxx11::string>const&>
              (local_b0,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_88);
    psVar11 = local_b8;
  }
  std::__cxx11::string::append((char *)psVar11);
  OffsetPrefix_abi_cxx11_((string *)local_138,this,field,true);
  std::__cxx11::string::_M_append((char *)psVar11,local_138._0_8_);
  if ((size_type *)local_138._0_8_ != psVar2) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  if ((((this->super_BaseGenerator).parser_)->opts).python_typing == false) {
    std::operator+(&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_);
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_158,(anonymous_namespace)::Indent_abi_cxx11_);
    psVar7 = puVar5 + 2;
    if ((size_type *)*puVar5 == psVar7) {
      local_138._16_8_ = *psVar7;
      local_138._24_8_ = puVar5[3];
      local_138._0_8_ = psVar2;
    }
    else {
      local_138._16_8_ = *psVar7;
      local_138._0_8_ = (size_type *)*puVar5;
    }
    local_138._8_8_ = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)psVar11,local_138._0_8_);
    if ((size_type *)local_138._0_8_ != psVar2) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_d8,"from ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar8) {
      local_f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_f8.field_2._8_8_ = plVar6[3];
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_f8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_f8._M_string_length = plVar6[1];
    *plVar6 = (long)paVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_68._M_p);
    puVar9 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_158.field_2._M_allocated_capacity = *puVar9;
      local_158.field_2._8_8_ = plVar6[3];
      local_158._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_158.field_2._M_allocated_capacity = *puVar9;
      local_158._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_158._M_string_length = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
    psVar7 = puVar5 + 2;
    if ((size_type *)*puVar5 == psVar7) {
      local_138._16_8_ = *psVar7;
      local_138._24_8_ = puVar5[3];
      local_138._0_8_ = psVar2;
    }
    else {
      local_138._16_8_ = *psVar7;
      local_138._0_8_ = (size_type *)*puVar5;
    }
    local_138._8_8_ = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)psVar11,local_138._0_8_);
    if ((size_type *)local_138._0_8_ != psVar2) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  std::operator+(&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f8,(anonymous_namespace)::Indent_abi_cxx11_);
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_158.field_2._M_allocated_capacity = *psVar7;
    local_158.field_2._8_8_ = plVar6[3];
    local_158._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar7;
    local_158._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_158._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
  psVar7 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar7) {
    local_138._16_8_ = *psVar7;
    local_138._24_8_ = puVar5[3];
    local_138._0_8_ = psVar2;
  }
  else {
    local_138._16_8_ = *psVar7;
    local_138._0_8_ = (size_type *)*puVar5;
  }
  local_138._8_8_ = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar11,local_138._0_8_);
  if ((size_type *)local_138._0_8_ != psVar2) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  paVar8 = &local_f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar8) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f8,(anonymous_namespace)::Indent_abi_cxx11_);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_158.field_2._M_allocated_capacity = *puVar9;
    local_158.field_2._8_8_ = plVar6[3];
    local_158._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_158.field_2._M_allocated_capacity = *puVar9;
    local_158._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_158._M_string_length = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  GenGetter_abi_cxx11_(&local_d8,this,local_38);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    uVar12 = local_158.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_d8._M_string_length + local_158._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      uVar12 = local_d8.field_2._M_allocated_capacity;
    }
    if (local_d8._M_string_length + local_158._M_string_length <= (ulong)uVar12) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_d8,0,(char *)0x0,(ulong)local_158._M_dataplus._M_p);
      goto LAB_0027fbe0;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_d8._M_dataplus._M_p);
LAB_0027fbe0:
  local_138._0_8_ = local_138 + 0x10;
  psVar7 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar7) {
    local_138._16_8_ = *psVar7;
    local_138._24_8_ = puVar5[3];
  }
  else {
    local_138._16_8_ = *psVar7;
    local_138._0_8_ = (size_type *)*puVar5;
  }
  local_138._8_8_ = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)psVar7 = 0;
  std::__cxx11::string::_M_append((char *)psVar11,local_138._0_8_);
  if ((size_type *)local_138._0_8_ != psVar2) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar8) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_d8,"obj, o)\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d8,(anonymous_namespace)::Indent_abi_cxx11_);
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar10) {
    local_f8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_f8.field_2._8_8_ = plVar6[3];
    local_f8._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_f8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_f8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_f8._M_string_length = plVar6[1];
  *plVar6 = (long)paVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f8,(anonymous_namespace)::Indent_abi_cxx11_);
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_158.field_2._M_allocated_capacity = *psVar7;
    local_158.field_2._8_8_ = plVar6[3];
    local_158._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar7;
    local_158._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_158._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
  psVar7 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar7) {
    local_138._16_8_ = *psVar7;
    local_138._24_8_ = puVar5[3];
    local_138._0_8_ = psVar2;
  }
  else {
    local_138._16_8_ = *psVar7;
    local_138._0_8_ = (size_type *)*puVar5;
  }
  local_138._8_8_ = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar11,local_138._0_8_);
  if ((size_type *)local_138._0_8_ != psVar2) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar8) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
  psVar7 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar7) {
    local_138._16_8_ = *psVar7;
    local_138._24_8_ = puVar5[3];
    local_138._0_8_ = psVar2;
  }
  else {
    local_138._16_8_ = *psVar7;
    local_138._0_8_ = (size_type *)*puVar5;
  }
  local_138._8_8_ = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar11,local_138._0_8_);
  if ((size_type *)local_138._0_8_ != psVar2) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,
                    CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,CONCAT71(local_88._17_7_,local_88[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GetUnionField(const StructDef &struct_def, const FieldDef &field,
                     std::string *code_ptr, ImportMap &imports) const {
    auto &code = *code_ptr;
    GenReceiver(struct_def, code_ptr);
    std::string return_ty = "flatbuffers.table.Table";

    bool is_native_table = TypeName(field) == "*flatbuffers.Table";
    ImportMapEntry import_entry;
    if (is_native_table) {
      import_entry = ImportMapEntry{ "flatbuffers.table", "Table" };
    } else {
      return_ty = TypeName(field);
      import_entry = ImportMapEntry{ GenPackageReference(field.value.type),
                                     TypeName(field) };
    }

    code += namer_.Method(field) + "(self)";
    if (parser_.opts.python_typing) {
      code += " -> Optional[" + return_ty + "]";
      imports.insert(ImportMapEntry{ "typing", "Optional" });
      imports.insert(import_entry);
    }
    code += ":";
    code += OffsetPrefix(field);

    if (!parser_.opts.python_typing) {
      code += Indent + Indent + Indent;
      code += "from " + import_entry.first + " import " + import_entry.second +
              "\n";
    }
    code += Indent + Indent + Indent + "obj = Table(bytearray(), 0)\n";
    code += Indent + Indent + Indent + GenGetter(field.value.type);
    code += "obj, o)\n" + Indent + Indent + Indent + "return obj\n";
    code += Indent + Indent + "return None\n\n";
  }